

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrintValidatorTests.cpp
# Opt level: O0

int testAudioFeatureSoundPrintBasic(void)

{
  Model *this;
  bool bVar1;
  ArrayFeatureType *pAVar2;
  FeatureType *this_00;
  FeatureType *this_01;
  ModelDescription *this_02;
  FeatureDescription *this_03;
  FeatureDescription *this_04;
  AudioFeaturePrint_Sound *this_05;
  ostream *poVar3;
  Result local_138;
  Result local_110;
  Result local_e8;
  AudioFeaturePrint *local_c0;
  AudioFeaturePrint *p;
  undefined1 local_b0 [8];
  Result result;
  Model model;
  FeatureDescription *output;
  FeatureDescription *input;
  ModelDescription *description;
  FeatureType *outputFeatureType;
  ArrayFeatureType *outputArrayFeatureType;
  FeatureType *inputFeatureType;
  ArrayFeatureType *inputArrayFeatureType;
  
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_00 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_00);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_00,pAVar2);
  pAVar2 = (ArrayFeatureType *)operator_new(0x48);
  CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar2);
  this_01 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(this_01);
  CoreML::Specification::FeatureType::set_allocated_multiarraytype(this_01,pAVar2);
  this_02 = (ModelDescription *)operator_new(0x78);
  CoreML::Specification::ModelDescription::ModelDescription(this_02);
  this_03 = CoreML::Specification::ModelDescription::add_input(this_02);
  this_04 = CoreML::Specification::ModelDescription::add_output(this_02);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_03,this_00);
  CoreML::Specification::FeatureDescription::set_allocated_type(this_04,this_01);
  this = (Model *)((long)&result.m_message.field_2 + 8);
  CoreML::Specification::Model::Model(this);
  CoreML::Specification::Model::set_allocated_description(this,this_02);
  CoreML::validate<(MLModelType)2006>
            ((Result *)local_b0,(Model *)((long)&result.m_message.field_2 + 8));
  bVar1 = CoreML::Result::good((Result *)local_b0);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x29);
    poVar3 = std::operator<<(poVar3,": error: ");
    poVar3 = std::operator<<(poVar3,"!((result).good())");
    poVar3 = std::operator<<(poVar3," was false, expected true.");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    inputArrayFeatureType._4_4_ = 1;
  }
  else {
    local_c0 = CoreML::Specification::Model::mutable_audiofeatureprint
                         ((Model *)((long)&result.m_message.field_2 + 8));
    CoreML::validate<(MLModelType)2006>(&local_e8,(Model *)((long)&result.m_message.field_2 + 8));
    CoreML::Result::operator=((Result *)local_b0,&local_e8);
    CoreML::Result::~Result(&local_e8);
    bVar1 = CoreML::Result::good((Result *)local_b0);
    if (bVar1) {
      poVar3 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                              );
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x2d);
      poVar3 = std::operator<<(poVar3,": error: ");
      poVar3 = std::operator<<(poVar3,"!((result).good())");
      poVar3 = std::operator<<(poVar3," was false, expected true.");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      inputArrayFeatureType._4_4_ = 1;
    }
    else {
      CoreML::Specification::CoreMLModels::AudioFeaturePrint::mutable_sound(local_c0);
      CoreML::validate<(MLModelType)2006>(&local_110,(Model *)((long)&result.m_message.field_2 + 8))
      ;
      CoreML::Result::operator=((Result *)local_b0,&local_110);
      CoreML::Result::~Result(&local_110);
      bVar1 = CoreML::Result::good((Result *)local_b0);
      if (bVar1) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                                );
        poVar3 = std::operator<<(poVar3,":");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x31);
        poVar3 = std::operator<<(poVar3,": error: ");
        poVar3 = std::operator<<(poVar3,"!((result).good())");
        poVar3 = std::operator<<(poVar3," was false, expected true.");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        inputArrayFeatureType._4_4_ = 1;
      }
      else {
        this_05 = CoreML::Specification::CoreMLModels::AudioFeaturePrint::mutable_sound(local_c0);
        CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound::set_version
                  (this_05,AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
        CoreML::validate<(MLModelType)2006>
                  (&local_138,(Model *)((long)&result.m_message.field_2 + 8));
        CoreML::Result::operator=((Result *)local_b0,&local_138);
        CoreML::Result::~Result(&local_138);
        bVar1 = CoreML::Result::good((Result *)local_b0);
        if (bVar1) {
          inputArrayFeatureType._4_4_ = 0;
        }
        else {
          poVar3 = std::operator<<((ostream *)&std::cout,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/AudioFeaturePrintValidatorTests.cpp"
                                  );
          poVar3 = std::operator<<(poVar3,":");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,0x35);
          poVar3 = std::operator<<(poVar3,": error: ");
          poVar3 = std::operator<<(poVar3,"(result).good()");
          poVar3 = std::operator<<(poVar3," was false, expected true.");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          inputArrayFeatureType._4_4_ = 1;
        }
      }
    }
  }
  p._4_4_ = 1;
  CoreML::Result::~Result((Result *)local_b0);
  CoreML::Specification::Model::~Model((Model *)((long)&result.m_message.field_2 + 8));
  return inputArrayFeatureType._4_4_;
}

Assistant:

int testAudioFeatureSoundPrintBasic() {

    Specification::ArrayFeatureType* inputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* inputFeatureType = new Specification::FeatureType();
    inputFeatureType->set_allocated_multiarraytype(inputArrayFeatureType);

    Specification::ArrayFeatureType* outputArrayFeatureType = new Specification::ArrayFeatureType();
    Specification::FeatureType* outputFeatureType = new Specification::FeatureType();
    outputFeatureType->set_allocated_multiarraytype(outputArrayFeatureType);

    Specification::ModelDescription* description = new Specification::ModelDescription();
    Specification::FeatureDescription* input = description->add_input();
    Specification::FeatureDescription* output = description->add_output();
    input->set_allocated_type(inputFeatureType);
    output->set_allocated_type(outputFeatureType);

    Specification::Model model;
    model.set_allocated_description(description);

    Result result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    auto *p = model.mutable_audiofeatureprint();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound();
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_BAD(result);

    p->mutable_sound()->set_version(Specification::CoreMLModels::AudioFeaturePrint_Sound_SoundVersion_SOUND_VERSION_1);
    result = validate<MLModelType_audioFeaturePrint>(model);
    ML_ASSERT_GOOD(result);
    
    return 0;
}